

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot-iostream.h
# Opt level: O2

void __thiscall
gnuplotio::PlotGroup::
add<std::vector<std::vector<std::tuple<double,double,double>,std::allocator<std::tuple<double,double,double>>>,std::allocator<std::vector<std::tuple<double,double,double>,std::allocator<std::tuple<double,double,double>>>>>,gnuplotio::Mode2D>
          (PlotGroup *this,
          vector<std::vector<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>,_std::allocator<std::vector<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>_>_>
          *arg,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *plotspec,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *text_array_record)

{
  bool bVar1;
  logic_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  bVar1 = std::operator==(text_array_record,"text");
  if (!bVar1) {
    bVar1 = std::operator==(text_array_record,"array");
    if (!bVar1) {
      bVar1 = std::operator==(text_array_record,"record");
      if (!bVar1) {
        this_00 = (logic_error *)__cxa_allocate_exception(0x10);
        std::operator+(&bStack_68,"text_array_record must be one of text, array, or record (was ",
                       text_array_record);
        std::operator+(&local_48,&bStack_68,")");
        std::logic_error::logic_error(this_00,(string *)&local_48);
        __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
      }
    }
  }
  bVar1 = std::operator==(text_array_record,"text");
  if (bVar1) {
    std::vector<gnuplotio::PlotData,std::allocator<gnuplotio::PlotData>>::
    emplace_back<std::vector<std::vector<std::tuple<double,double,double>,std::allocator<std::tuple<double,double,double>>>,std::allocator<std::vector<std::tuple<double,double,double>,std::allocator<std::tuple<double,double,double>>>>>const&,std::__cxx11::string_const&,char_const(&)[6],gnuplotio::Mode2D,gnuplotio::ModeText>
              ((vector<gnuplotio::PlotData,std::allocator<gnuplotio::PlotData>> *)&this->plots,arg,
               plotspec,(char (*) [6])"array",(Mode2D *)&local_48,(ModeText *)&bStack_68);
  }
  else {
    std::vector<gnuplotio::PlotData,std::allocator<gnuplotio::PlotData>>::
    emplace_back<std::vector<std::vector<std::tuple<double,double,double>,std::allocator<std::tuple<double,double,double>>>,std::allocator<std::vector<std::tuple<double,double,double>,std::allocator<std::tuple<double,double,double>>>>>const&,std::__cxx11::string_const&,std::__cxx11::string_const&,gnuplotio::Mode2D,gnuplotio::ModeBinary>
              ((vector<gnuplotio::PlotData,std::allocator<gnuplotio::PlotData>> *)&this->plots,arg,
               plotspec,text_array_record,(Mode2D *)&local_48,(ModeBinary *)&bStack_68);
  }
  return;
}

Assistant:

void add(const T &arg, const std::string &plotspec, const std::string &text_array_record, OrganizationMode) {
        if(!(
            text_array_record == "text" ||
            text_array_record == "array" ||
            text_array_record == "record"
        )) throw std::logic_error("text_array_record must be one of text, array, or record (was "+
            text_array_record+")");

        if(text_array_record == "text") {
            plots.emplace_back(arg, plotspec,
                "array", // arbitrary value
                OrganizationMode(), ModeText());
        } else {
            plots.emplace_back(arg, plotspec, text_array_record,
                OrganizationMode(), ModeBinary());
        }
    }